

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.c
# Opt level: O2

int pp(char *filename,FILE *infile,FILE *outfile)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  option_t *poVar4;
  char *pcVar5;
  
  poVar4 = get_option("-ftabstop=");
  tabstop = (poVar4->value).num;
  f = infile;
  filnam = filename;
  iVar1 = fgetc((FILE *)infile);
  uVar2 = fgetc((FILE *)f);
  uVar3 = fgetc((FILE *)f);
  if ((((char)iVar1 != -0x11) || ((uVar2 & 0xff) != 0xbb)) || ((uVar3 & 0xff) != 0xbf)) {
    rewind((FILE *)f);
  }
  c = 10;
  l = fgetc((FILE *)f);
  mlc = 0;
  line = 1;
  fprintf((FILE *)outfile,"# 1 \"%s\"\n",filename);
  do {
    linebuf[0] = '\0';
    column = 0;
    update_line = '\0';
    iVar1 = readline(linebuf);
    line = line + 1;
    for (pcVar5 = linebuf; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
      fputc((int)*pcVar5,(FILE *)outfile);
    }
    if (update_line == '\x01') {
      fprintf((FILE *)outfile,"# %d \"%s\"\n",(ulong)(uint)line,filename);
    }
  } while (iVar1 != 0);
  return 1;
}

Assistant:

int pp(const char* filename, FILE* infile, FILE* outfile)
{
    unsigned char bom1, bom2, bom3;
    char* pl;
    int loop;
    
    tabstop = get_option("-ftabstop=")->value.num;
    f = infile;

    
    filnam = filename;

    /* accept UTF-8 BOM */
    bom1 = fgetc(f);
    bom2 = fgetc(f);
    bom3 = fgetc(f);
    if (!(bom1 == 0xEF && bom2 == 0xBB && bom3 == 0xBF))
        rewind(f);

    c = '\n';
    l = fgetc(f);
    mlc = 0;
    line = 1;

    fprintf(outfile, "# 1 \"%s\"\n", filename);
    do
    {
        int curline = line;
        loop = 0;
        pl = linebuf;
        *pl = 0;
        column = 0;    
        update_line = 0;
        
        loop = readline(pl);  
        ++line;  
        
        pl = linebuf;
        while (*pl)
            fputc(*pl++, outfile);
            
        if (update_line)
            fprintf(outfile, "# %d \"%s\"\n", line, filename);
            
        process(curline);
            
     
    } while (loop);

    return 1;
}